

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSymm.c
# Opt level: O0

int zdd_group_move(DdManager *table,int x,int y,Move **moves)

{
  Move *pMVar1;
  DdHalfWord DVar2;
  int iVar3;
  DdNode *pDVar4;
  DdHalfWord local_54;
  DdHalfWord local_50;
  int swapy;
  int swapx;
  int yprev;
  int gybot;
  int gxbot;
  int gxtop;
  int temp;
  int i;
  int size;
  Move *move;
  Move **moves_local;
  int y_local;
  int x_local;
  DdManager *table_local;
  
  local_50 = 0xffffffff;
  local_54 = 0xffffffff;
  gybot = table->subtableZ[x].next;
  swapx = table->subtableZ[y].next;
  while (table->subtableZ[swapx].next != y) {
    swapx = table->subtableZ[swapx].next;
  }
  swapy = swapx;
  moves_local._0_4_ = y;
  moves_local._4_4_ = x;
  while (DVar2 = moves_local._4_4_, (int)moves_local._4_4_ <= (int)(DdHalfWord)moves_local) {
    while (gybot < (int)(DdHalfWord)moves_local) {
      gxbot = table->subtableZ[(int)moves_local._4_4_].next;
      if (gxbot == moves_local._4_4_) {
        gxbot = (DdHalfWord)moves_local;
      }
      gxtop = gybot;
      while (table->subtableZ[gxtop].next != moves_local._4_4_) {
        gxtop = table->subtableZ[gxtop].next;
      }
      table->subtableZ[gxtop].next = (DdHalfWord)moves_local;
      if (table->subtableZ[(int)(DdHalfWord)moves_local].next == (DdHalfWord)moves_local) {
        table->subtableZ[(int)moves_local._4_4_].next = moves_local._4_4_;
      }
      else {
        table->subtableZ[(int)moves_local._4_4_].next =
             table->subtableZ[(int)(DdHalfWord)moves_local].next;
      }
      if (swapy == (DdHalfWord)moves_local) {
        swapy = moves_local._4_4_;
      }
      else {
        table->subtableZ[swapy].next = moves_local._4_4_;
      }
      table->subtableZ[(int)(DdHalfWord)moves_local].next = gxbot;
      iVar3 = cuddZddSwapInPlace(table,moves_local._4_4_,(DdHalfWord)moves_local);
      if (iVar3 == 0) goto LAB_00c29205;
      local_50 = moves_local._4_4_;
      local_54 = (DdHalfWord)moves_local;
      moves_local._0_4_ = moves_local._4_4_;
      moves_local._4_4_ = moves_local._4_4_ - 1;
    }
    if ((DdHalfWord)moves_local < table->subtableZ[(int)(DdHalfWord)moves_local].next) {
      moves_local._0_4_ = table->subtableZ[(int)(DdHalfWord)moves_local].next;
    }
    swapy = gybot;
    gybot = gybot + 1;
    moves_local._4_4_ = DVar2 + 1;
  }
  pDVar4 = cuddDynamicAllocNode(table);
  if (pDVar4 == (DdNode *)0x0) {
LAB_00c29205:
    while (*moves != (Move *)0x0) {
      pMVar1 = (*moves)->next;
      (*moves)->y = 0;
      *(DdNode **)&(*moves)->flags = table->nextFree;
      table->nextFree = (DdNode *)*moves;
      *moves = pMVar1;
    }
    table_local._4_4_ = 0;
  }
  else {
    pDVar4->index = local_50;
    pDVar4->ref = local_54;
    *(uint *)((long)&pDVar4->next + 4) = table->keysZ;
    (pDVar4->type).kids.T = (DdNode *)*moves;
    *moves = (Move *)pDVar4;
    table_local._4_4_ = table->keysZ;
  }
  return table_local._4_4_;
}

Assistant:

static int
zdd_group_move(
  DdManager * table,
  int  x,
  int  y,
  Move ** moves)
{
    Move        *move;
    int         size;
    int         i, temp, gxtop, gxbot, gybot, yprev;
    int         swapx = -1, swapy = -1;

#ifdef DD_DEBUG
    assert(x < y);      /* we assume that x < y */
#endif
    /* Find top and bottom for the two groups. */
    gxtop = table->subtableZ[x].next;
    gxbot = x;
    gybot = table->subtableZ[y].next;
    while (table->subtableZ[gybot].next != (unsigned) y)
        gybot = table->subtableZ[gybot].next;
    yprev = gybot;

    while (x <= y) {
        while (y > gxtop) {
            /* Set correct symmetries. */
            temp = table->subtableZ[x].next;
            if (temp == x)
                temp = y;
            i = gxtop;
            for (;;) {
                if (table->subtableZ[i].next == (unsigned) x) {
                    table->subtableZ[i].next = y;
                    break;
                } else {
                    i = table->subtableZ[i].next;
                }
            }
            if (table->subtableZ[y].next != (unsigned) y) {
                table->subtableZ[x].next = table->subtableZ[y].next;
            } else {
                table->subtableZ[x].next = x;
            }

            if (yprev != y) {
                table->subtableZ[yprev].next = x;
            } else {
                yprev = x;
            }
            table->subtableZ[y].next = temp;

            size = cuddZddSwapInPlace(table, x, y);
            if (size == 0)
                goto zdd_group_moveOutOfMem;
            swapx = x;
            swapy = y;
            y = x;
            x--;
        } /* while y > gxtop */

        /* Trying to find the next y. */
        if (table->subtableZ[y].next <= (unsigned) y) {
            gybot = y;
        } else {
            y = table->subtableZ[y].next;
        }

        yprev = gxtop;
        gxtop++;
        gxbot++;
        x = gxbot;
    } /* while x <= y, end of group movement */
    move = (Move *)cuddDynamicAllocNode(table);
    if (move == NULL)
        goto zdd_group_moveOutOfMem;
    move->x = swapx;
    move->y = swapy;
    move->size = table->keysZ;
    move->next = *moves;
    *moves = move;

    return(table->keysZ);

zdd_group_moveOutOfMem:
    while (*moves != NULL) {
        move = (*moves)->next;
        cuddDeallocMove(table, *moves);
        *moves = move;
    }
    return(0);

}